

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void doTruncatedFile(char *fileName,int64_t offset)

{
  void *pvVar1;
  ulong uVar2;
  size_t __nbytes;
  int __fd;
  allocator<char> local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string outName;
  File f;
  File outFile;
  
  File::File(&f);
  File::File(&outFile);
  File::open(&f,fileName,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,fileName,&local_e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,".back",&local_ea);
  std::operator+(&outName,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  __nbytes = 0;
  File::open(&outFile,outName._M_dataplus._M_p,2);
  pvVar1 = operator_new__(0x10000);
  File::seek(&f,offset,smBegin);
  __fd = (int)pvVar1;
  uVar2 = File::read(&f,__fd,(void *)0x10000,__nbytes);
  while (0 < (int)uVar2) {
    File::write(&outFile,__fd,(void *)(uVar2 & 0xffffffff),__nbytes);
    uVar2 = File::read(&f,__fd,(void *)0x10000,__nbytes);
  }
  std::__cxx11::string::~string((string *)&outName);
  File::~File(&outFile);
  File::~File(&f);
  return;
}

Assistant:

void doTruncatedFile(const char* fileName, const int64_t offset)
{
    File f;
    File outFile;

    f.open(fileName, File::ofRead);
    const std::string outName = std::string(fileName) + std::string(".back");
    outFile.open(outName.c_str(), File::ofWrite);

    constexpr uint32_t bufSize = 1024 * 64;
    const auto buffer = new uint8_t[bufSize];
    f.seek(offset);
    int readed = f.read(buffer, bufSize);
    while (readed > 0)
    {
        outFile.write(buffer, readed);
        readed = f.read(buffer, bufSize);
    }
}